

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O3

void __thiscall toml::Value::~Value(Value *this)

{
  ulong uVar1;
  string *this_00;
  
  switch(this->type_) {
  case STRING_TYPE:
    this_00 = (string *)(this->field_1).array_;
    if (this_00 != (string *)0x0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*(undefined1 **)&this_00->_M_dataplus != &this_00->field_2) {
        operator_delete(*(undefined1 **)&this_00->_M_dataplus,
                        (ulong)((long)&((_Base_ptr)(this_00->field_2)._M_allocated_capacity)->
                                       _M_color + 1));
      }
    }
    uVar1 = 0x20;
    break;
  case TIME_TYPE:
    this_00 = (string *)(this->field_1).null_;
    uVar1 = 8;
    break;
  case ARRAY_TYPE:
    this_00 = (this->field_1).string_;
    if (this_00 != (string *)0x0) {
      std::vector<toml::Value,_std::allocator<toml::Value>_>::~vector
                ((vector<toml::Value,_std::allocator<toml::Value>_> *)this_00);
    }
    uVar1 = 0x18;
    break;
  case TABLE_TYPE:
    this_00 = (this->field_1).string_;
    if (this_00 != (string *)0x0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                   *)this_00);
    }
    uVar1 = 0x30;
    break;
  default:
    return;
  }
  operator_delete(this_00,uVar1);
  return;
}

Assistant:

inline Value::~Value()
{
    switch (type_) {
    case STRING_TYPE:
        delete string_;
        break;
    case TIME_TYPE:
        delete time_;
        break;
    case ARRAY_TYPE:
        delete array_;
        break;
    case TABLE_TYPE:
        delete table_;
        break;
    default:
        break;
    }
}